

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O0

void __thiscall
HawkTracer::parser::ProtocolReader::_read_event
          (ProtocolReader *this,bool *is_error,Event *event,Event *base_event)

{
  Event *pEVar1;
  bool bVar2;
  FieldTypeId FVar3;
  element_type *this_00;
  element_type *peVar4;
  element_type *peVar5;
  FieldType local_90;
  FieldType value;
  shared_ptr<HawkTracer::parser::EventKlassField> *field;
  __normal_iterator<std::shared_ptr<HawkTracer::parser::EventKlassField>_*,_std::vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>_>
  local_78;
  iterator __end2;
  iterator __begin2;
  undefined1 local_58 [40];
  vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
  *local_30;
  vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
  *__range2;
  Event *base_event_local;
  Event *event_local;
  bool *is_error_local;
  ProtocolReader *this_local;
  
  __range2 = (vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
              *)base_event;
  base_event_local = event;
  event_local = (Event *)is_error;
  is_error_local = (bool *)this;
  Event::get_klass((Event *)local_58);
  this_00 = std::
            __shared_ptr_access<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_58);
  EventKlass::get_fields
            ((vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
              *)(local_58 + 0x10),this_00);
  std::shared_ptr<const_HawkTracer::parser::EventKlass>::~shared_ptr
            ((shared_ptr<const_HawkTracer::parser::EventKlass> *)local_58);
  local_30 = (vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
              *)(local_58 + 0x10);
  __end2 = std::
           vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
           ::begin(local_30);
  local_78._M_current =
       (shared_ptr<HawkTracer::parser::EventKlassField> *)
       std::
       vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
       ::end(local_30);
  do {
    bVar2 = __gnu_cxx::operator!=(&__end2,&local_78);
    if (!bVar2) {
      field._4_4_ = 2;
LAB_0013e7c2:
      std::
      vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
      ::~vector((vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
                 *)(local_58 + 0x10));
      if (field._4_4_ != 1) {
        *(undefined1 *)&(event_local->_values)._M_h._M_buckets = 0;
      }
      return;
    }
    value.f_EVENT =
         (Event *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<HawkTracer::parser::EventKlassField>_*,_std::vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>_>
                  ::operator*(&__end2);
    local_90.f_UINT64 = 0;
    peVar4 = std::
             __shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)value.f_EVENT);
    bVar2 = EventKlassField::is_numeric(peVar4);
    if (bVar2) {
LAB_0013e5f7:
      peVar4 = std::
               __shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)value.f_EVENT);
      bVar2 = _read_numeric(this,&local_90,peVar4);
      if (bVar2) goto LAB_0013e62d;
LAB_0013e6d7:
      *(undefined1 *)&(event_local->_values)._M_h._M_buckets = 1;
      field._4_4_ = 1;
      goto LAB_0013e7c2;
    }
    peVar4 = std::
             __shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)value.f_EVENT);
    FVar3 = EventKlassField::get_type_id(peVar4);
    if (FVar3 == POINTER) goto LAB_0013e5f7;
LAB_0013e62d:
    peVar4 = std::
             __shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)value.f_EVENT);
    FVar3 = EventKlassField::get_type_id(peVar4);
    if ((FVar3 == STRING) && (bVar2 = _read_string(this,&local_90), !bVar2)) goto LAB_0013e6d7;
    peVar4 = std::
             __shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)value.f_EVENT);
    FVar3 = EventKlassField::get_type_id(peVar4);
    if (FVar3 == STRUCT) {
      peVar4 = std::
               __shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)value.f_EVENT);
      bVar2 = _read_struct(this,&local_90,peVar4,base_event_local,(Event *)__range2);
      if (!bVar2) goto LAB_0013e6d7;
    }
    pEVar1 = base_event_local;
    if ((this->_flat_events & 1U) == 0) {
      peVar5 = std::__shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>::
               get((__shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2> *)
                   value.f_EVENT);
      Event::set_value(pEVar1,peVar5,local_90);
    }
    else {
      peVar4 = std::
               __shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)value.f_EVENT);
      FVar3 = EventKlassField::get_type_id(peVar4);
      pEVar1 = base_event_local;
      if (FVar3 != STRUCT) {
        peVar5 = std::__shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>
                 ::get((__shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>
                        *)value.f_EVENT);
        Event::set_value(pEVar1,peVar5,local_90);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<HawkTracer::parser::EventKlassField>_*,_std::vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void ProtocolReader::_read_event(bool& is_error, Event& event, Event* base_event)
{
    for (const auto& field : event.get_klass()->get_fields())
    {
        FieldType value{};
        if (((field->is_numeric() || field->get_type_id() == FieldTypeId::POINTER) && !_read_numeric(value, *field)) || // read numeric or pointer
                (field->get_type_id() == FieldTypeId::STRING && !_read_string(value)) || // read string
                (field->get_type_id() == FieldTypeId::STRUCT && !_read_struct(value, *field, &event, base_event))) // read struct
        {
            is_error = true;
            return;
        }

        if (_flat_events)
        {
            if (field->get_type_id() != FieldTypeId::STRUCT)
            {
                event.set_value(field.get(), value);
            }
        }
        else
        {
            event.set_value(field.get(), value);
        }
    }

    is_error = false;
}